

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemSMC.cpp
# Opt level: O1

void __thiscall chrono::ChSystemSMC::ArchiveIN(ChSystemSMC *this,ChArchiveIn *marchive)

{
  TangentialDisplacementModel_mapper mtangential_mapper;
  AdhesionForceModel_mapper madhesion_mapper;
  ContactForceModel_mapper mmodel_mapper;
  ChEnumMapper<chrono::ChSystemSMC::AdhesionForceModel> local_c8;
  ChEnumMapper<chrono::ChSystemSMC::ContactForceModel> local_a8;
  ContactForceModel_mapper local_88;
  ChEnumMapper<chrono::ChSystemSMC::TangentialDisplacementModel> local_68;
  char *local_48;
  ChEnumMapper<chrono::ChSystemSMC::TangentialDisplacementModel> *local_40;
  undefined1 local_38;
  
  ChArchiveIn::VersionRead<chrono::ChSystemSMC>(marchive);
  ChSystem::ArchiveIN(&this->super_ChSystem,marchive);
  local_88.super_ChEnumMapper<chrono::ChSystemSMC::ContactForceModel>.value_ptr =
       (ContactForceModel *)&(this->super_ChSystem).field_0x379;
  local_88.super_ChEnumMapper<chrono::ChSystemSMC::ContactForceModel>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0x98714c;
  local_88.super_ChEnumMapper<chrono::ChSystemSMC::ContactForceModel>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_88);
  local_88.super_ChEnumMapper<chrono::ChSystemSMC::ContactForceModel>.value_ptr =
       (ContactForceModel *)&this->m_minSlipVelocity;
  local_88.super_ChEnumMapper<chrono::ChSystemSMC::ContactForceModel>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0x98715c;
  local_88.super_ChEnumMapper<chrono::ChSystemSMC::ContactForceModel>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_88);
  local_88.super_ChEnumMapper<chrono::ChSystemSMC::ContactForceModel>.value_ptr =
       (ContactForceModel *)&this->m_characteristicVelocity;
  local_88.super_ChEnumMapper<chrono::ChSystemSMC::ContactForceModel>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0x98716e;
  local_88.super_ChEnumMapper<chrono::ChSystemSMC::ContactForceModel>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_88);
  my_enum_mappers::ContactForceModel_mapper::ContactForceModel_mapper(&local_88);
  my_enum_mappers::ContactForceModel_mapper::operator()
            (&local_a8,&local_88,(ContactForceModel *)&(this->super_ChSystem).field_0x37c);
  local_c8.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x987187;
  local_c8.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::AdhesionForceModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::AdhesionForceModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  local_c8.value_ptr = (AdhesionForceModel *)&local_a8;
  (**(code **)(*(long *)marchive + 0x58))(marchive);
  local_a8.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b35828
  ;
  if (local_a8.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  my_enum_mappers::AdhesionForceModel_mapper::AdhesionForceModel_mapper
            ((AdhesionForceModel_mapper *)&local_a8);
  my_enum_mappers::AdhesionForceModel_mapper::operator()
            (&local_c8,(AdhesionForceModel_mapper *)&local_a8,&this->m_adhesion_model);
  local_68.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x987195;
  local_68.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  local_68.value_ptr = (TangentialDisplacementModel *)&local_c8;
  (**(code **)(*(long *)marchive + 0x58))(marchive);
  local_c8.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b35928
  ;
  if (local_c8.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::AdhesionForceModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::AdhesionForceModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::AdhesionForceModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::AdhesionForceModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  my_enum_mappers::TangentialDisplacementModel_mapper::TangentialDisplacementModel_mapper
            ((TangentialDisplacementModel_mapper *)&local_c8);
  my_enum_mappers::TangentialDisplacementModel_mapper::operator()
            (&local_68,(TangentialDisplacementModel_mapper *)&local_c8,&this->m_tdispl_model);
  local_48 = "tangential_model";
  local_38 = 0;
  local_40 = &local_68;
  (**(code **)(*(long *)marchive + 0x58))(marchive);
  local_68.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b35a28
  ;
  if (local_68.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::TangentialDisplacementModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  (*(this->super_ChSystem).super_ChIntegrableIIorder.super_ChIntegrable._vptr_ChIntegrable[0x3d])
            (this);
  local_c8.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b35a28
  ;
  if (local_c8.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::AdhesionForceModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::AdhesionForceModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::AdhesionForceModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::AdhesionForceModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_a8.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b35928
  ;
  if (local_a8.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_88.super_ChEnumMapper<chrono::ChSystemSMC::ContactForceModel>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b35828;
  if (local_88.super_ChEnumMapper<chrono::ChSystemSMC::ContactForceModel>.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super_ChEnumMapper<chrono::ChSystemSMC::ContactForceModel>.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSystemSMC::ContactForceModel>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChSystemSMC::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChSystemSMC>();

    // deserialize parent class
    ChSystem::ArchiveIN(marchive);

    // stream in all member data:
    marchive >> CHNVP(m_use_mat_props);
    marchive >> CHNVP(m_minSlipVelocity);
    marchive >> CHNVP(m_characteristicVelocity);
    my_enum_mappers::ContactForceModel_mapper mmodel_mapper;
    marchive >> CHNVP(mmodel_mapper(m_contact_model), "contact_model");
    my_enum_mappers::AdhesionForceModel_mapper madhesion_mapper;
    marchive >> CHNVP(madhesion_mapper(m_adhesion_model), "adhesion_model");
    my_enum_mappers::TangentialDisplacementModel_mapper mtangential_mapper;
    marchive >> CHNVP(mtangential_mapper(m_tdispl_model), "tangential_model");
    //***TODO*** complete...

    // Recompute statistics, offsets, etc.
    this->Setup();
}